

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSGlue::emitMemory(Wasm2JSGlue *this)

{
  size_type *psVar1;
  pointer puVar2;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var3;
  Expression *pEVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  pointer puVar8;
  ostream *poVar9;
  Module *pMVar10;
  ulong uVar11;
  ulong uVar12;
  Global *pGVar13;
  undefined8 *puVar14;
  long *plVar15;
  ulong uVar16;
  ulong *puVar17;
  long *plVar18;
  Wasm2JSGlue *pWVar19;
  ulong uVar20;
  uint uVar21;
  undefined1 local_288 [392];
  ostream *local_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  undefined1 local_c0;
  undefined1 local_bf;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  Wasm2JSGlue *local_38;
  
  bVar7 = needsBufferView(this->wasm);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(&this->out->out,"  var bufferView;\n",0x12);
  }
  puVar8 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar2) {
    do {
      local_38 = this;
      if (((puVar8->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&this->out->out,"  var memorySegments = {};\n",0x1b);
        break;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_38->out->out,
               "  var base64ReverseLookup = new Uint8Array(123/*\'z\'+1*/);\n  for (var i = 25; i >= 0; --i) {\n    base64ReverseLookup[48+i] = 52+i; // \'0-9\'\n    base64ReverseLookup[65+i] = i; // \'A-Z\'\n    base64ReverseLookup[97+i] = 26+i; // \'a-z\'\n  }\n  base64ReverseLookup[43] = 62; // \'+\'\n  base64ReverseLookup[47] = 63; // \'/\'\n  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */\n  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {\n    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == \'=\') - (b64[bLength-1] == \'=\');\n    for (; i < bLength; i += 4) {\n      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];\n      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];\n      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;\n      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;\n      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];\n    }"
               ,0x411);
    if (((local_38->wasm->features).features & 0x10) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_38->out->out,"\n    return uint8Array;",0x17);
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_38->out->out,"\n  }\n",5);
    pMVar10 = local_38->wasm;
    puVar8 = (pMVar10->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar19 = local_38;
    if ((pMVar10->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar8) {
      uVar21 = 1;
      uVar11 = 0;
      do {
        if ((puVar8[uVar11]._M_t.
             super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
             super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
             super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true) {
          poVar9 = &pWVar19->out->out;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"memorySegments[",0xf);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"] = base64DecodeToExistingUint8Array(new Uint8Array(",0x34);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,", 0, \"",6);
          base64Encode_abi_cxx11_
                    ((string *)local_288,
                     &(puVar8[uVar11]._M_t.
                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_288._0_8_,local_288._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\");\n",4);
          pWVar19 = local_38;
          if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
            operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            pWVar19 = local_38;
          }
        }
        uVar11 = (ulong)uVar21;
        pMVar10 = pWVar19->wasm;
        puVar8 = (pMVar10->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar21 = uVar21 + 1;
      } while (uVar11 < (ulong)((long)(pMVar10->dataSegments).
                                      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3
                               ));
    }
    puVar2 = (pMVar10->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar7 = puVar2 != puVar8;
    if ((bVar7) &&
       (((puVar8->_M_t).
         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
         super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == true)) {
      uVar11 = (long)puVar2 - (long)puVar8 >> 3;
      uVar21 = 1;
      do {
        uVar20 = (ulong)uVar21;
        bVar7 = uVar20 < uVar11;
        if (uVar11 <= uVar20) break;
        uVar21 = uVar21 + 1;
      } while ((puVar8[uVar20]._M_t.
                super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                _M_t.
                super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive != false
              );
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&pWVar19->out->out,"function initActiveSegments(imports) {\n",0x27);
      puVar8 = (local_38->wasm->dataSegments).
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pWVar19 = local_38;
      if ((local_38->wasm->dataSegments).
          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != puVar8) {
        uVar11 = 0;
        do {
          if ((puVar8[uVar11]._M_t.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
               _M_t.
               super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
               super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->isPassive == false)
          {
            poVar9 = &pWVar19->out->out;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"  base64DecodeToExistingUint8Array(bufferView, ",0x2f);
            _Var3._M_head_impl =
                 puVar8[uVar11]._M_t.
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
            pEVar4 = (_Var3._M_head_impl)->offset;
            if (pEVar4->_id == '\x0e') {
              local_100 = poVar9;
              uVar12 = Literal::getInteger((Literal *)(pEVar4 + 1));
              uVar20 = -uVar12;
              if (0 < (long)uVar12) {
                uVar20 = uVar12;
              }
              uVar21 = 1;
              if (9 < uVar20) {
                uVar16 = uVar20;
                uVar6 = 4;
                do {
                  uVar21 = uVar6;
                  if (uVar16 < 100) {
                    uVar21 = uVar21 - 2;
                    goto LAB_00cfe5d1;
                  }
                  if (uVar16 < 1000) {
                    uVar21 = uVar21 - 1;
                    goto LAB_00cfe5d1;
                  }
                  if (uVar16 < 10000) goto LAB_00cfe5d1;
                  bVar7 = 99999 < uVar16;
                  uVar16 = uVar16 / 10000;
                  uVar6 = uVar21 + 4;
                } while (bVar7);
                uVar21 = uVar21 + 1;
              }
LAB_00cfe5d1:
              local_58 = &local_48;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_58,(char)uVar21 - (char)((long)uVar12 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)((long)local_58 - ((long)uVar12 >> 0x3f)),uVar21,uVar20);
              poVar9 = local_100;
            }
            else {
              pEVar4 = (_Var3._M_head_impl)->offset;
              if (pEVar4->_id != '\n') {
                Fatal::Fatal((Fatal *)local_288);
                Fatal::operator<<((Fatal *)local_288,
                                  (char (*) [43])"non-constant offsets aren\'t supported yet\n");
                Fatal::~Fatal((Fatal *)local_288);
              }
              pGVar13 = Module::getGlobal(local_38->wasm,(Name)pEVar4[1]);
              local_c8 = 0x5b7374726f706d69;
              local_c0 = 0x27;
              local_d0 = 9;
              local_bf = 0;
              pcVar5 = (pGVar13->super_Importable).module.super_IString.str._M_str;
              local_b8 = local_a8;
              local_d8 = &local_c8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,pcVar5,
                         pcVar5 + (pGVar13->super_Importable).module.super_IString.str._M_len);
              uVar20 = 0xf;
              if (local_d8 != &local_c8) {
                uVar20 = local_c8;
              }
              if (uVar20 < (ulong)(local_b0 + local_d0)) {
                uVar20 = 0xf;
                if (local_b8 != local_a8) {
                  uVar20 = local_a8[0];
                }
                if (uVar20 < (ulong)(local_b0 + local_d0)) goto LAB_00cfe304;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
              }
              else {
LAB_00cfe304:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8);
              }
              local_78 = &local_68;
              plVar15 = puVar14 + 2;
              if ((long *)*puVar14 == plVar15) {
                local_68 = *plVar15;
                uStack_60 = puVar14[3];
              }
              else {
                local_68 = *plVar15;
                local_78 = (long *)*puVar14;
              }
              local_70 = puVar14[1];
              *puVar14 = plVar15;
              puVar14[1] = 0;
              *(undefined1 *)plVar15 = 0;
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_78);
              local_f8 = &local_e8;
              puVar17 = (ulong *)(plVar15 + 2);
              if ((ulong *)*plVar15 == puVar17) {
                local_e8 = *puVar17;
                uStack_e0 = (undefined4)plVar15[3];
                uStack_dc = *(undefined4 *)((long)plVar15 + 0x1c);
              }
              else {
                local_e8 = *puVar17;
                local_f8 = (ulong *)*plVar15;
              }
              local_f0 = plVar15[1];
              *plVar15 = (long)puVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              pcVar5 = (pGVar13->super_Importable).base.super_IString.str._M_str;
              local_98 = local_88;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,pcVar5,
                         pcVar5 + (pGVar13->super_Importable).base.super_IString.str._M_len);
              uVar20 = 0xf;
              if (local_f8 != &local_e8) {
                uVar20 = local_e8;
              }
              if (uVar20 < (ulong)(local_90 + local_f0)) {
                uVar20 = 0xf;
                if (local_98 != local_88) {
                  uVar20 = local_88[0];
                }
                if (uVar20 < (ulong)(local_90 + local_f0)) goto LAB_00cfe446;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_98,0,(char *)0x0,(ulong)local_f8);
              }
              else {
LAB_00cfe446:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_98);
              }
              local_288._0_8_ = local_288 + 0x10;
              psVar1 = puVar14 + 2;
              if ((size_type *)*puVar14 == psVar1) {
                local_288._16_8_ = *psVar1;
                local_288._24_8_ = puVar14[3];
              }
              else {
                local_288._16_8_ = *psVar1;
                local_288._0_8_ = (size_type *)*puVar14;
              }
              local_288._8_8_ = puVar14[1];
              *puVar14 = psVar1;
              puVar14[1] = 0;
              *(char *)psVar1 = '\0';
              plVar15 = (long *)std::__cxx11::string::append(local_288);
              local_58 = &local_48;
              plVar18 = plVar15 + 2;
              if ((long *)*plVar15 == plVar18) {
                local_48 = *plVar18;
                lStack_40 = plVar15[3];
              }
              else {
                local_48 = *plVar18;
                local_58 = (long *)*plVar15;
              }
              local_50 = plVar15[1];
              *plVar15 = (long)plVar18;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
                operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
              }
              if (local_98 != local_88) {
                operator_delete(local_98,local_88[0] + 1);
              }
              if (local_f8 != &local_e8) {
                operator_delete(local_f8,local_e8 + 1);
              }
              if (local_78 != &local_68) {
                operator_delete(local_78,local_68 + 1);
              }
              if (local_b8 != local_a8) {
                operator_delete(local_b8,local_a8[0] + 1);
              }
              if (local_d8 != &local_c8) {
                operator_delete(local_d8,local_c8 + 1);
              }
            }
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)local_58,local_50);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,", \"",3);
            base64Encode_abi_cxx11_
                      ((string *)local_288,
                       &(puVar8[uVar11]._M_t.
                         super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                         .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->data);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)local_288._0_8_,local_288._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\");\n",4);
            if ((undefined1 *)local_288._0_8_ != local_288 + 0x10) {
              operator_delete((void *)local_288._0_8_,local_288._16_8_ + 1);
            }
            pWVar19 = local_38;
            if (local_58 != &local_48) {
              operator_delete(local_58,local_48 + 1);
              pWVar19 = local_38;
            }
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          puVar8 = (pWVar19->wasm->dataSegments).
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)(pWVar19->wasm->dataSegments).
                                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >>
                                 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>(&pWVar19->out->out,"}\n",2);
    }
  }
  return;
}

Assistant:

void Wasm2JSGlue::emitMemory() {
  if (needsBufferView(wasm)) {
    // Create a helper bufferView to access the buffer if we need one. We use it
    // for creating memory segments if we have any (we may not if the segments
    // are shipped in a side .mem file, for example), and also in bulk memory
    // operations.
    // This will get assigned during `asmFunc` (and potentially re-assigned
    // during __wasm_memory_grow).
    // TODO: We should probably just share a single HEAPU8 var.
    out << "  var bufferView;\n";
  }

  // If there are no memory segments, we don't need to emit any support code for
  // segment creation.
  if (wasm.dataSegments.empty()) {
    return;
  }

  // If we have passive memory segments, we need to store those.
  for (auto& seg : wasm.dataSegments) {
    if (seg->isPassive) {
      out << "  var memorySegments = {};\n";
      break;
    }
  }

  out <<
    R"(  var base64ReverseLookup = new Uint8Array(123/*'z'+1*/);
  for (var i = 25; i >= 0; --i) {
    base64ReverseLookup[48+i] = 52+i; // '0-9'
    base64ReverseLookup[65+i] = i; // 'A-Z'
    base64ReverseLookup[97+i] = 26+i; // 'a-z'
  }
  base64ReverseLookup[43] = 62; // '+'
  base64ReverseLookup[47] = 63; // '/'
  /** @noinline Inlining this function would mean expanding the base64 string 4x times in the source code, which Closure seems to be happy to do. */
  function base64DecodeToExistingUint8Array(uint8Array, offset, b64) {
    var b1, b2, i = 0, j = offset, bLength = b64.length, end = offset + (bLength*3>>2) - (b64[bLength-2] == '=') - (b64[bLength-1] == '=');
    for (; i < bLength; i += 4) {
      b1 = base64ReverseLookup[b64.charCodeAt(i+1)];
      b2 = base64ReverseLookup[b64.charCodeAt(i+2)];
      uint8Array[j++] = base64ReverseLookup[b64.charCodeAt(i)] << 2 | b1 >> 4;
      if (j < end) uint8Array[j++] = b1 << 4 | b2 >> 2;
      if (j < end) uint8Array[j++] = b2 << 6 | base64ReverseLookup[b64.charCodeAt(i+3)];
    })";
  if (wasm.features.hasBulkMemory()) {
    // Passive segments in bulk memory are initialized into new arrays that are
    // passed into here, and we need to return them.
    out << R"(
    return uint8Array;)";
  }
  out << R"(
  }
)";

  for (Index i = 0; i < wasm.dataSegments.size(); i++) {
    auto& seg = wasm.dataSegments[i];
    if (seg->isPassive) {
      // Fancy passive segments are decoded into typed arrays on the side, for
      // later copying.
      out << "memorySegments[" << i
          << "] = base64DecodeToExistingUint8Array(new Uint8Array("
          << seg->data.size() << ")"
          << ", 0, \"" << base64Encode(seg->data) << "\");\n";
    }
  }

  if (hasActiveSegments(wasm)) {
    auto globalOffset = [&](const DataSegment& segment) {
      if (auto* c = segment.offset->dynCast<Const>()) {
        return std::to_string(c->value.getInteger());
      }
      if (auto* get = segment.offset->dynCast<GlobalGet>()) {
        auto internalName = get->name;
        auto importedGlobal = wasm.getGlobal(internalName);
        return std::string("imports['") + importedGlobal->module.toString() +
               "']['" + importedGlobal->base.toString() + "']";
      }
      Fatal() << "non-constant offsets aren't supported yet\n";
    };

    out << "function initActiveSegments(imports) {\n";
    for (Index i = 0; i < wasm.dataSegments.size(); i++) {
      auto& seg = wasm.dataSegments[i];
      if (!seg->isPassive) {
        // Plain active segments are decoded directly into the main memory.
        out << "  base64DecodeToExistingUint8Array(bufferView, "
            << globalOffset(*seg) << ", \"" << base64Encode(seg->data)
            << "\");\n";
      }
    }
    out << "}\n";
  }
}